

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void av1_enc_build_inter_predictor_y(MACROBLOCKD *xd,int mi_row,int mi_col)

{
  scale_factors *psVar1;
  int_interpfilters interp_filters;
  int in_EDX;
  int in_ESI;
  MACROBLOCKD *in_RDI;
  scale_factors *sf;
  MV mv;
  uint8_t *dst;
  buf_2d *dst_buf;
  InterPredParams inter_pred_params;
  macroblockd_plane *pd;
  int mi_y;
  int mi_x;
  int bd;
  undefined4 in_stack_fffffffffffffe3c;
  int iVar2;
  undefined4 in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe4c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe54;
  int in_stack_fffffffffffffe6c;
  InterPredParams *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe90;
  undefined1 *__dest;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  scale_factors *in_stack_fffffffffffffeb0;
  buf_2d *in_stack_fffffffffffffeb8;
  undefined1 auStack_e8 [36];
  undefined4 local_c4;
  macroblockd_plane *local_40;
  int local_38;
  int local_34;
  MACROBLOCKD *local_28;
  
  local_34 = in_EDX << 2;
  local_38 = in_ESI << 2;
  local_40 = in_RDI->plane;
  psVar1 = in_RDI->block_ref_scale_factors[0];
  interp_filters.as_int._1_3_ = 0;
  interp_filters.as_int._0_1_ = in_RDI->plane[0].width;
  iVar2 = in_RDI->bd;
  local_28 = in_RDI;
  is_cur_buf_hbd(in_RDI);
  uVar3 = 0;
  av1_init_inter_params
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
             ((*local_28->mi)->interp_filters).as_int,(int)((ulong)local_40->pre >> 0x20),
             (int)local_40->pre,(int)((ulong)psVar1 >> 0x20),in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,interp_filters);
  __dest = auStack_e8;
  bd = local_28->bd;
  get_conv_params_no_round
            ((ConvolveParams *)&stack0xfffffffffffffe98,0,0,local_28->tmp_conv_dst,0x80,0,bd);
  memcpy(__dest,&stack0xfffffffffffffe98,0x30);
  local_c4 = 0;
  av1_enc_build_one_inter_predictor
            ((uint8_t *)CONCAT44(in_stack_fffffffffffffe54,uVar3),in_stack_fffffffffffffe4c,
             (MV *)CONCAT44(in_stack_fffffffffffffe44,iVar2),
             (InterPredParams *)CONCAT44(in_stack_fffffffffffffe3c,bd));
  return;
}

Assistant:

void av1_enc_build_inter_predictor_y(MACROBLOCKD *xd, int mi_row, int mi_col) {
  const int mi_x = mi_col * MI_SIZE;
  const int mi_y = mi_row * MI_SIZE;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  InterPredParams inter_pred_params;

  struct buf_2d *const dst_buf = &pd->dst;
  uint8_t *const dst = dst_buf->buf;
  const MV mv = xd->mi[0]->mv[0].as_mv;
  const struct scale_factors *const sf = xd->block_ref_scale_factors[0];

  av1_init_inter_params(&inter_pred_params, pd->width, pd->height, mi_y, mi_x,
                        pd->subsampling_x, pd->subsampling_y, xd->bd,
                        is_cur_buf_hbd(xd), false, sf, pd->pre,
                        xd->mi[0]->interp_filters);

  inter_pred_params.conv_params = get_conv_params_no_round(
      0, AOM_PLANE_Y, xd->tmp_conv_dst, MAX_SB_SIZE, false, xd->bd);

  inter_pred_params.conv_params.use_dist_wtd_comp_avg = 0;
  av1_enc_build_one_inter_predictor(dst, dst_buf->stride, &mv,
                                    &inter_pred_params);
}